

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ExprNode * __thiscall Parser::exprNotTest(Parser *this)

{
  int iVar1;
  ExprNode *pEVar2;
  Token notOp;
  Token local_78;
  
  Tokenizer::getToken(&local_78,this->tokenizer);
  Tokenizer::ungetToken(this->tokenizer);
  iVar1 = std::__cxx11::string::compare((char *)&local_78);
  if (iVar1 == 0) {
    pEVar2 = exprNotTest(this);
  }
  else {
    pEVar2 = compareExpr(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._string._M_dataplus._M_p != &local_78._string.field_2) {
    operator_delete(local_78._string._M_dataplus._M_p,
                    local_78._string.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._relOp._M_dataplus._M_p != &local_78._relOp.field_2) {
    operator_delete(local_78._relOp._M_dataplus._M_p,
                    local_78._relOp.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._name._M_dataplus._M_p != &local_78._name.field_2) {
    operator_delete(local_78._name._M_dataplus._M_p,local_78._name.field_2._M_allocated_capacity + 1
                   );
  }
  return pEVar2;
}

Assistant:

ExprNode *Parser::exprNotTest(){
    Token notOp = tokenizer.getToken();
    tokenizer.ungetToken();
    if(notOp.isNot()){
        ExprNode *notTest = exprNotTest();
        return notTest;
    }else {
        ExprNode *comparison = compareExpr();
        return comparison;
    }
}